

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,io_context *io_context,string *address,uint16_t portNum,bool port_reuse,
          int nominalBufferSize)

{
  bool in_stack_000001a5;
  uint16_t in_stack_000001a6;
  string *in_stack_000001a8;
  io_context *in_stack_000001b0;
  SocketFactory *in_stack_000001b8;
  TcpServer *in_stack_000001c0;
  int in_stack_000001d0;
  SocketFactory *in_stack_ffffffffffffffa0;
  
  SocketFactory::SocketFactory(in_stack_ffffffffffffffa0);
  TcpServer(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,
            in_stack_000001a6,in_stack_000001a5,in_stack_000001d0);
  SocketFactory::~SocketFactory((SocketFactory *)0x709ac0);
  return;
}

Assistant:

TcpServer::TcpServer(
    asio::io_context& io_context,
    const std::string& address,
    uint16_t portNum,
    bool port_reuse,
    int nominalBufferSize) :
    TcpServer::TcpServer(
        SocketFactory(),
        io_context,
        address,
        portNum,
        port_reuse,
        nominalBufferSize)
{
}